

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_ext_dma.c
# Opt level: O1

MPP_RET allocator_ext_dma_release(void *ctx,MppBufferInfo *info)

{
  undefined8 in_RAX;
  undefined4 uVar1;
  undefined8 uVar2;
  
  uVar1 = (undefined4)((ulong)in_RAX >> 0x20);
  if (ctx == (void *)0x0) {
    uVar2 = CONCAT44(uVar1,0x77);
    _mpp_log_l(2,(char *)0x0,"Assertion %s failed at %s:%d\n",(char *)0x0,"ctx",
               "allocator_ext_dma_release",uVar2);
    uVar1 = (undefined4)((ulong)uVar2 >> 0x20);
    if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00171dd5;
  }
  if (info->size == 0) {
    _mpp_log_l(2,(char *)0x0,"Assertion %s failed at %s:%d\n",(char *)0x0,"info->size",
               "allocator_ext_dma_release",CONCAT44(uVar1,0x78));
    if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_00171dd5:
      abort();
    }
  }
  if (info->ptr != (void *)0x0) {
    munmap(info->ptr,info->size);
  }
  info->ptr = (void *)0x0;
  info->hnd = (void *)0x0;
  info->fd = -1;
  info->size = 0;
  return MPP_OK;
}

Assistant:

static MPP_RET allocator_ext_dma_release(void *ctx, MppBufferInfo *info)
{
    mpp_assert(ctx);
    mpp_assert(info->size);

    if (info->ptr)
        munmap(info->ptr, info->size);

    info->ptr   = NULL;
    info->hnd   = NULL;
    info->fd    = -1;
    info->size  = 0;

    return MPP_OK;
}